

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

byte_vec_t * __thiscall sfc::Map::gbc_banked_data(byte_vec_t *__return_storage_ptr__,Map *this)

{
  value_type vVar1;
  uint uVar2;
  runtime_error *this_00;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  uint local_4c;
  uint local_48;
  uint i_1;
  uint i;
  byte_vec_t linear_data;
  Map *this_local;
  byte_vec_t *banked_data;
  
  uVar2 = width(this);
  if (((uVar2 & 0x1f) == 0) && (uVar2 = height(this), (uVar2 & 0x1f) == 0)) {
    native_data((byte_vec_t *)&i,this,false,0,0);
    i_1._3_1_ = 0;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size((byte_vec_t *)&i);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i_1 + 2));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,sVar3,(allocator<unsigned_char> *)((long)&i_1 + 2));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i_1 + 2));
    for (local_48 = 0;
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i),
        (ulong)local_48 < sVar3 >> 1; local_48 = local_48 + 1) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                          (ulong)(local_48 << 1));
      vVar1 = *pvVar4;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,(ulong)local_48);
      *pvVar5 = vVar1;
    }
    for (local_4c = 0;
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i),
        (ulong)local_4c < sVar3 >> 1; local_4c = local_4c + 1) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                          (ulong)(local_4c * 2 + 1));
      vVar1 = *pvVar4;
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,(ulong)local_4c + (sVar3 >> 1));
      *pvVar5 = vVar1;
    }
    i_1._3_1_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"gbc/out-gbc-bank requires map dimensions to be multiples of 32");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

byte_vec_t Map::gbc_banked_data() const {
  if ((width() % 32) || (height() % 32))
    throw std::runtime_error("gbc/out-gbc-bank requires map dimensions to be multiples of 32");

  const auto linear_data = native_data();
  auto banked_data = byte_vec_t(linear_data.size());
  for (unsigned i = 0; i < linear_data.size() >> 1; ++i) banked_data[i] = linear_data[i << 1];
  for (unsigned i = 0; i < linear_data.size() >> 1; ++i) banked_data[i + (linear_data.size() >> 1)] = linear_data[(i << 1) + 1];
  return banked_data;
}